

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compute_scalar_product_of_persistence_vectors.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  char cVar4;
  int iVar5;
  ostream *poVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  size_t j;
  long lVar11;
  size_type sVar12;
  char **__args;
  size_type sVar13;
  ulong uVar14;
  double dVar15;
  vector<const_char_*,_std::allocator<const_char_*>_> filenames;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  scalar_product;
  vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
  vectors;
  ofstream out;
  allocator_type local_289;
  char **local_288;
  iterator iStack_280;
  char **local_278;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_270;
  vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
  local_258;
  value_type_conflict1 local_240;
  undefined1 local_238 [8];
  pointer ppStack_230;
  pointer local_228;
  pointer pdStack_220;
  pointer local_218;
  pointer pdStack_210;
  ios_base local_140 [272];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "This program computes scalar product of persistence vectors stored in a file (the file needs to "
             ,0x60);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"be created beforehand). \n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,
             "The parameters of this programs are names of files with persistence vectors.\n",0x4d);
  if (argc < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Wrong number of parameters, the program will now terminate \n"
               ,0x3c);
    iVar5 = 1;
  }
  else {
    local_288 = (char **)0x0;
    iStack_280._M_current = (char **)0x0;
    local_278 = (char **)0x0;
    __args = argv + 1;
    lVar7 = (ulong)(uint)argc - 1;
    do {
      if (iStack_280._M_current == local_278) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_288,iStack_280,__args);
      }
      else {
        *iStack_280._M_current = *__args;
        iStack_280._M_current = iStack_280._M_current + 1;
      }
      __args = __args + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    local_258.
    super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_258.
    super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_258.
    super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
    ::reserve(&local_258,(long)iStack_280._M_current - (long)local_288 >> 3);
    if (iStack_280._M_current == local_288) {
      sVar13 = 0;
    }
    else {
      sVar13 = 0;
      do {
        local_218 = (pointer)0x0;
        pdStack_210 = (pointer)0x0;
        local_228 = (pointer)0x0;
        pdStack_220 = (pointer)0x0;
        local_238 = (undefined1  [8])0x0;
        ppStack_230 = (pointer)0x0;
        Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>::
        load_from_file((Vector_distances_in_diagram<Gudhi::Euclidean_distance> *)local_238,
                       local_288[sVar13]);
        std::
        vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
        ::push_back(&local_258,(Vector_distances_in_diagram<Gudhi::Euclidean_distance> *)local_238);
        if (pdStack_220 != (pointer)0x0) {
          operator_delete(pdStack_220,(long)pdStack_210 - (long)pdStack_220);
        }
        if (local_238 != (undefined1  [8])0x0) {
          operator_delete((void *)local_238,(long)local_228 - (long)local_238);
        }
        sVar13 = sVar13 + 1;
      } while (sVar13 != (long)iStack_280._M_current - (long)local_288 >> 3);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_270,sVar13,(allocator_type *)local_238);
    if ((long)iStack_280._M_current - (long)local_288 != 0) {
      sVar13 = (long)iStack_280._M_current - (long)local_288 >> 3;
      lVar7 = 0;
      sVar12 = 0;
      do {
        local_240 = 0.0;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_238,sVar13,&local_240,&local_289
                  );
        std::vector<double,_std::allocator<double>_>::operator=
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&((local_270.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar7),
                   (vector<double,_std::allocator<double>_> *)local_238);
        if (local_238 != (undefined1  [8])0x0) {
          operator_delete((void *)local_238,(long)local_228 - (long)local_238);
        }
        sVar12 = sVar12 + 1;
        sVar13 = (long)iStack_280._M_current - (long)local_288 >> 3;
        lVar7 = lVar7 + 0x18;
      } while (sVar12 != sVar13);
    }
    if ((long)local_258.
              super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_258.
              super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      lVar7 = ((long)local_258.
                     super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_258.
                     super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
      lVar9 = 0;
      do {
        pdVar1 = local_258.
                 super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar9].sorted_vector_of_distances.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar10 = (long)local_258.
                       super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar9].sorted_vector_of_distances.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
        pdVar2 = local_270.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar9].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        lVar11 = lVar9;
        do {
          pdVar3 = local_258.
                   super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar11].sorted_vector_of_distances.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = (long)local_258.
                        super__Vector_base<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar11].sorted_vector_of_distances
                        .super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar3 >> 3;
          if (uVar10 <= uVar8) {
            uVar8 = uVar10;
          }
          dVar15 = 0.0;
          if (uVar8 != 0) {
            uVar14 = 0;
            do {
              dVar15 = dVar15 + pdVar1[uVar14] * pdVar3[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar8 != uVar14);
          }
          local_270.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar11].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar9] = dVar15;
          pdVar2[lVar11] = dVar15;
          lVar11 = lVar11 + 1;
        } while (lVar11 != lVar7);
        lVar9 = lVar9 + 1;
      } while (lVar9 != lVar7);
    }
    std::ofstream::ofstream(local_238);
    std::ofstream::open(local_238,0x105210);
    if (local_270.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_270.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar7 = 0;
      do {
        if (local_270.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_270.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar9 = 0;
          do {
            poVar6 = std::ostream::_M_insert<double>
                               (local_270.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar7].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar9]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            poVar6 = std::ostream::_M_insert<double>
                               (local_270.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar7].
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar9]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            lVar9 = lVar9 + 1;
          } while (lVar9 != ((long)local_270.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_270.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555);
        }
        std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + '8');
        std::ostream::put('8');
        std::ostream::flush();
        cVar4 = (char)local_238;
        std::ios::widen(SUB81(((pointer)((long)local_238 + -0x20))->second,0) + cVar4);
        std::ostream::put(cVar4);
        std::ostream::flush();
        lVar7 = lVar7 + 1;
      } while (lVar7 != ((long)local_270.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_270.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
              );
    }
    std::ofstream::close();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Distance can be found in \'scalar_product.vect\' file\n",0x34)
    ;
    local_238 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_238 + (long)_VTT[-2].second) = __filebuf;
    std::filebuf::~filebuf((filebuf *)&ppStack_230);
    std::ios_base::~ios_base(local_140);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_270);
    std::
    vector<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>,_std::allocator<Gudhi::Persistence_representations::Vector_distances_in_diagram<Gudhi::Euclidean_distance>_>_>
    ::~vector(&local_258);
    if (local_288 != (char **)0x0) {
      operator_delete(local_288,(long)local_278 - (long)local_288);
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program computes scalar product of persistence vectors stored in a file (the file needs to "
            << "be created beforehand). \n"
            << "The parameters of this programs are names of files with persistence vectors.\n";

  if (argc < 3) {
    std::clog << "Wrong number of parameters, the program will now terminate \n";
    return 1;
  }

  std::vector<const char*> filenames;
  for (int i = 1; i < argc; ++i) {
    filenames.push_back(argv[i]);
  }
  std::vector<Vector_distances_in_diagram> vectors;
  vectors.reserve(filenames.size());
  for (size_t file_no = 0; file_no != filenames.size(); ++file_no) {
    Vector_distances_in_diagram l;
    l.load_from_file(filenames[file_no]);
    vectors.push_back(l);
  }

  // and now we will compute the scalar product of landscapes.

  // first we prepare an array:
  std::vector<std::vector<double> > scalar_product(filenames.size());
  for (size_t i = 0; i != filenames.size(); ++i) {
    std::vector<double> v(filenames.size(), 0);
    scalar_product[i] = v;
  }

  // and now we can compute the scalar product:
  for (size_t i = 0; i != vectors.size(); ++i) {
    for (size_t j = i; j != vectors.size(); ++j) {
      scalar_product[i][j] = scalar_product[j][i] = vectors[i].compute_scalar_product(vectors[j]);
    }
  }

  // and now output the result to the screen and a file:
  std::ofstream out;
  out.open("scalar_product.vect");
  for (size_t i = 0; i != scalar_product.size(); ++i) {
    for (size_t j = 0; j != scalar_product.size(); ++j) {
      std::clog << scalar_product[i][j] << " ";
      out << scalar_product[i][j] << " ";
    }
    std::clog << std::endl;
    out << std::endl;
  }
  out.close();

  std::clog << "Distance can be found in 'scalar_product.vect' file\n";
  return 0;
}